

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O1

string * __thiscall
groundupdb::BucketQuery::bucket_abi_cxx11_(string *__return_storage_ptr__,BucketQuery *this)

{
  Impl *pIVar1;
  long lVar2;
  
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdb::BucketQuery::Impl,_std::default_delete<groundupdb::BucketQuery::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::BucketQuery::Impl_*,_std::default_delete<groundupdb::BucketQuery::Impl>_>
           .super__Head_base<0UL,_groundupdb::BucketQuery::Impl_*,_false>._M_head_impl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)&(pIVar1->m_bucket)._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,(pIVar1->m_bucket)._M_string_length + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
BucketQuery::bucket() const {
  return mImpl->m_bucket;
}